

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printShiftImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  cs_detail *pcVar1;
  undefined4 uVar2;
  MCOperand *op;
  ulong uVar3;
  cs_struct *pcVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  char *pcVar6;
  
  op = MCInst_getOperand(MI,3);
  uVar3 = MCOperand_getImm(op);
  uVar5 = (uint)uVar3 & 0x1f;
  if ((uVar3 & 0x20) == 0) {
    if ((uVar3 & 0x1f) == 0) {
      return;
    }
    pcVar6 = ", lsl #%u";
    if (9 < uVar5) {
      pcVar6 = ", lsl #0x%x";
    }
    SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),pcVar6,(ulong)uVar5);
    pcVar4 = MI->csh;
    uVar2 = 2;
  }
  else {
    if ((uVar3 & 0x1f) == 0) {
      uVar5 = 0x20;
    }
    pcVar6 = ", asr #%u";
    if (9 < uVar5) {
      pcVar6 = ", asr #0x%x";
    }
    SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),pcVar6,(ulong)uVar5);
    pcVar4 = MI->csh;
    uVar2 = 1;
  }
  if (pcVar4->detail != CS_OPT_OFF) {
    pcVar1 = MI->flat_insn->detail;
    *(undefined4 *)(pcVar1->groups + (ulong)((uint)(pcVar1->field_6).arm.op_count * 0x30) + 9) =
         uVar2;
    pcVar1 = MI->flat_insn->detail;
    *(uint *)(pcVar1->groups + (ulong)((uint)(pcVar1->field_6).arm.op_count * 0x30) + 0xd) = uVar5;
  }
  return;
}

Assistant:

static void printShiftImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned ShiftOp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	bool isASR = (ShiftOp & (1 << 5)) != 0;
	unsigned Amt = ShiftOp & 0x1f;
	if (isASR) {
		unsigned tmp = Amt == 0 ? 32 : Amt;
		if (tmp > HEX_THRESHOLD)
			SStream_concat(O, ", asr #0x%x", tmp);
		else
			SStream_concat(O, ", asr #%u", tmp);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_ASR;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
		}
	} else if (Amt) {
		if (Amt > HEX_THRESHOLD)
			SStream_concat(O, ", lsl #0x%x", Amt);
		else
			SStream_concat(O, ", lsl #%u", Amt);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_LSL;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = Amt;
		}
	}
}